

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

ExtensionInfo *
google::protobuf::internal::anon_unknown_59::FindRegisteredExtension
          (MessageLite *extendee,int number)

{
  bool bVar1;
  iterator local_50;
  undefined1 local_40 [8];
  const_iterator it;
  ExtensionInfoKey info;
  int number_local;
  MessageLite *extendee_local;
  
  if (internal::(anonymous_namespace)::global_registry ==
      (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
       *)0x0) {
    extendee_local = (MessageLite *)0x0;
  }
  else {
    it.inner_.field_1 = (anon_union_8_1_a8a14541_for_iterator_2)extendee;
    _local_40 = (iterator)
                absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                ::find<google::protobuf::internal::(anonymous_namespace)::ExtensionInfoKey>
                          (internal::(anonymous_namespace)::global_registry,
                           (key_arg<google::protobuf::internal::(anonymous_namespace)::ExtensionInfoKey>
                            *)&it.inner_.field_1);
    local_50 = (iterator)
               absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
               ::end(internal::(anonymous_namespace)::global_registry);
    bVar1 = absl::lts_20250127::container_internal::operator==
                      ((const_iterator *)local_40,(const_iterator *)&local_50);
    if (bVar1) {
      extendee_local = (MessageLite *)0x0;
    }
    else {
      extendee_local =
           (MessageLite *)
           absl::lts_20250127::container_internal::
           raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
           ::const_iterator::operator*((const_iterator *)local_40);
    }
  }
  return (ExtensionInfo *)extendee_local;
}

Assistant:

const ExtensionInfo* FindRegisteredExtension(const MessageLite* extendee,
                                             int number) {
  if (!global_registry) return nullptr;

  ExtensionInfoKey info;
  info.message = extendee;
  info.number = number;

  auto it = global_registry->find(info);
  if (it == global_registry->end()) {
    return nullptr;
  } else {
    return &*it;
  }
}